

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.hh
# Opt level: O0

void __thiscall
kratos::PortBundleRef::PortBundleRef
          (PortBundleRef *this,Generator *generator,PortBundleDefinition *def)

{
  PortBundleDefinition *def_local;
  Generator *generator_local;
  PortBundleRef *this_local;
  
  PackedInterface::PackedInterface(&this->super_PackedInterface);
  (this->super_PackedInterface)._vptr_PackedInterface =
       (_func_int **)&PTR_member_names_abi_cxx11__005c1648;
  this->generator = generator;
  PortBundleDefinition::PortBundleDefinition(&this->definition_,def);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->name_mappings_);
  return;
}

Assistant:

PortBundleRef(Generator *generator, PortBundleDefinition def)
        : generator(generator), definition_(std::move(def)) {}